

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.cpp
# Opt level: O2

int find_nal_unit(uint8_t *buf,int size,int *nal_start,int *nal_end)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  
  *nal_start = 0;
  *nal_end = 0;
  uVar3 = 0;
  do {
    if ((buf[uVar3] == '\0') && (buf[uVar3 + 1] == '\0')) {
      if (buf[uVar3 + 2] == '\x01') {
LAB_00105be2:
        iVar2 = (int)uVar3;
        if (((buf[iVar2] == '\0') && (buf[(long)iVar2 + 1] == '\0')) &&
           (buf[(long)iVar2 + 2] == '\x01')) {
          iVar2 = iVar2 + 3;
          *nal_start = iVar2;
          lVar4 = (uVar3 & 0xffffffff) + 2;
          while (((buf[lVar4 + 1] != '\0' || (buf[lVar4 + 2] != '\0')) ||
                 ((buf[lVar4 + 3] != '\0' && (buf[lVar4 + 3] != '\x01'))))) {
            iVar2 = iVar2 + 1;
            lVar4 = lVar4 + 1;
            if ((long)size + -4 <= lVar4) {
              *nal_end = size;
              return -1;
            }
          }
          *nal_end = iVar2;
          return iVar2 - *nal_start;
        }
        return 0;
      }
      if ((buf[uVar3 + 2] == '\0') && (buf[uVar3 + 3] == '\x01')) {
        uVar3 = (ulong)((int)uVar3 + 1);
        goto LAB_00105be2;
      }
    }
    bVar1 = (long)size + -5 <= (long)uVar3;
    uVar3 = uVar3 + 1;
    if (bVar1) {
      return 0;
    }
  } while( true );
}

Assistant:

int find_nal_unit(uint8_t* buf, int size, int* nal_start, int* nal_end)
{
    int i;
    // find start
    *nal_start = 0;
    *nal_end = 0;

    i = 0;
    while (   //( next_bits( 24 ) != 0x000001 && next_bits( 32 ) != 0x00000001 )
            (buf[i] != 0 || buf[i+1] != 0 || buf[i+2] != 0x01) &&
            (buf[i] != 0 || buf[i+1] != 0 || buf[i+2] != 0 || buf[i+3] != 0x01)
            )
    {
        i++; // skip leading zero
        if (i+4 >= size) { return 0; } // did not find nal start
    }

    if  (buf[i] != 0 || buf[i+1] != 0 || buf[i+2] != 0x01) // ( next_bits( 24 ) != 0x000001 )
    {
        i++;
    }

    if  (buf[i] != 0 || buf[i+1] != 0 || buf[i+2] != 0x01) { /* error, should never happen */ return 0; }
    i+= 3;
    *nal_start = i;

    while (   //( next_bits( 24 ) != 0x000000 && next_bits( 24 ) != 0x000001 )
            (buf[i] != 0 || buf[i+1] != 0 || buf[i+2] != 0) &&
            (buf[i] != 0 || buf[i+1] != 0 || buf[i+2] != 0x01)
            )
    {
        i++;
        // FIXME the next line fails when reading a nal that ends exactly at the end of the data
        if (i+3 >= size) { *nal_end = size; return -1; } // did not find nal end, stream ended first
    }

    *nal_end = i;
    return (*nal_end - *nal_start);
}